

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav__pcm_to_f32(float *pOut,drwav_uint8 *pIn,size_t sampleCount,uint bytesPerSample)

{
  uint in_ECX;
  ulong in_RDX;
  drwav_int32 *in_RSI;
  float *in_RDI;
  uint j;
  uint shift;
  drwav_uint64 sample;
  uint i;
  uint local_30;
  int local_2c;
  ulong local_28;
  uint local_20;
  drwav_int32 *local_10;
  float *local_8;
  
  if (in_ECX == 1) {
    drwav_u8_to_f32(in_RDI,(drwav_uint8 *)in_RSI,in_RDX);
  }
  else if (in_ECX == 2) {
    drwav_s16_to_f32(in_RDI,(drwav_int16 *)in_RSI,in_RDX);
  }
  else if (in_ECX == 3) {
    drwav_s24_to_f32(in_RDI,(drwav_uint8 *)in_RSI,in_RDX);
  }
  else if (in_ECX == 4) {
    drwav_s32_to_f32(in_RDI,in_RSI,in_RDX);
  }
  else if (in_ECX < 9) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
      local_28 = 0;
      local_2c = (8 - in_ECX) * 8;
      for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
        if (7 < local_30) {
          __assert_fail("j < 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0x1239,
                        "void drwav__pcm_to_f32(float *, const drwav_uint8 *, size_t, unsigned int)"
                       );
        }
        local_28 = (ulong)*(byte *)((long)local_10 + (ulong)local_30) << ((byte)local_2c & 0x3f) |
                   local_28;
        local_2c = local_2c + 8;
      }
      local_10 = (drwav_int32 *)((long)local_10 + (ulong)local_30);
      *local_8 = (float)((double)(long)local_28 / 9.223372036854776e+18);
      local_8 = local_8 + 1;
    }
  }
  else {
    memset(in_RDI,0,in_RDX << 2);
  }
  return;
}

Assistant:

static void drwav__pcm_to_f32(float* pOut, const drwav_uint8* pIn, size_t sampleCount, unsigned int bytesPerSample)
{
    unsigned int i;

    /* Special case for 8-bit sample data because it's treated as unsigned. */
    if (bytesPerSample == 1) {
        drwav_u8_to_f32(pOut, pIn, sampleCount);
        return;
    }

    /* Slightly more optimal implementation for common formats. */
    if (bytesPerSample == 2) {
        drwav_s16_to_f32(pOut, (const drwav_int16*)pIn, sampleCount);
        return;
    }
    if (bytesPerSample == 3) {
        drwav_s24_to_f32(pOut, pIn, sampleCount);
        return;
    }
    if (bytesPerSample == 4) {
        drwav_s32_to_f32(pOut, (const drwav_int32*)pIn, sampleCount);
        return;
    }


    /* Anything more than 64 bits per sample is not supported. */
    if (bytesPerSample > 8) {
        DRWAV_ZERO_MEMORY(pOut, sampleCount * sizeof(*pOut));
        return;
    }


    /* Generic, slow converter. */
    for (i = 0; i < sampleCount; ++i) {
        drwav_uint64 sample = 0;
        unsigned int shift  = (8 - bytesPerSample) * 8;

        unsigned int j;
        for (j = 0; j < bytesPerSample; j += 1) {
            DRWAV_ASSERT(j < 8);
            sample |= (drwav_uint64)(pIn[j]) << shift;
            shift  += 8;
        }

        pIn += j;
        *pOut++ = (float)((drwav_int64)sample / 9223372036854775807.0);
    }
}